

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrint.h
# Opt level: O2

string * __thiscall
cppqc::PrettyPrint<std::vector<int,std::allocator<int>>>::toString_abi_cxx11_
          (string *__return_storage_ptr__,PrettyPrint<std::vector<int,std::allocator<int>>> *this,
          vector<int,_std::allocator<int>_> *x)

{
  ostringstream out;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_190,
                  (vector<int,_std::allocator<int>_> *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(const T& x) {
    std::ostringstream out;
    out << x;
    return out.str();
  }